

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O0

bool updateScatterData(double value0,double value1,HighsScatterData *scatter_data)

{
  reference pvVar1;
  int *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  bool local_1;
  
  if ((in_XMM0_Qa <= 0.0) || (in_XMM1_Qa <= 0.0)) {
    local_1 = false;
  }
  else {
    in_RDI[1] = in_RDI[1] + 1;
    in_RDI[2] = in_RDI[2] + 1;
    if (in_RDI[2] == *in_RDI) {
      in_RDI[2] = 0;
    }
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 4),(long)in_RDI[2]);
    *pvVar1 = in_XMM0_Qa;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 10),(long)in_RDI[2]);
    *pvVar1 = in_XMM1_Qa;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool updateScatterData(const double value0, const double value1,
                       HighsScatterData& scatter_data) {
  if (value0 <= 0 || value1 <= 0) return false;
  scatter_data.num_point_++;
  scatter_data.last_point_++;
  if (scatter_data.last_point_ == scatter_data.max_num_point_)
    scatter_data.last_point_ = 0;
  scatter_data.value0_[scatter_data.last_point_] = value0;
  scatter_data.value1_[scatter_data.last_point_] = value1;
  return true;
}